

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

AddrInfo * __thiscall
AddrManImpl::Create(AddrManImpl *this,CAddress *addr,CNetAddr *addrSource,nid_type *pnId)

{
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *this_00;
  pointer plVar1;
  pointer plVar2;
  iterator __position;
  long lVar3;
  Network NVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  long in_FS_OFFSET;
  nid_type nId;
  long local_c0;
  direct_or_indirect local_b8;
  uint local_a8;
  undefined8 local_a0;
  uint16_t local_98;
  rep local_90;
  ServiceFlags SStack_88;
  rep local_80;
  rep rStack_78;
  char *local_70;
  undefined8 uStack_68;
  size_type local_60;
  undefined8 local_58;
  rep local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = this->nIdCount;
  this->nIdCount = local_c0 + 1;
  AddrInfo::AddrInfo((AddrInfo *)&local_b8.indirect_contents,addr,addrSource);
  this_00 = &this->mapInfo;
  pmVar5 = std::__detail::
           _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_c0);
  if (0x10 < (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._size) {
    free((pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union.indirect_contents.
         indirect);
  }
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       local_b8.indirect_contents.indirect;
  *(undefined8 *)((long)&(pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._union + 8) =
       local_b8._8_8_;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_addr._size = local_a8;
  local_a8 = 0;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_net = (undefined4)local_a0;
  (pmVar5->super_CAddress).super_CService.super_CNetAddr.m_scope_id = local_a0._4_4_;
  (pmVar5->super_CAddress).super_CService.port = local_98;
  (pmVar5->super_CAddress).nTime.__d.__r = local_90;
  (pmVar5->super_CAddress).nServices = SStack_88;
  (pmVar5->m_last_try).__d.__r = local_80;
  (pmVar5->m_last_count_attempt).__d.__r = rStack_78;
  if (0x10 < (pmVar5->source).m_addr._size) {
    free((pmVar5->source).m_addr._union.indirect_contents.indirect);
  }
  (pmVar5->source).m_addr._union.indirect_contents.indirect = local_70;
  *(undefined8 *)((long)&(pmVar5->source).m_addr._union + 8) = uStack_68;
  (pmVar5->source).m_addr._size = local_60;
  local_60 = 0;
  (pmVar5->source).m_net = (undefined4)local_58;
  (pmVar5->source).m_scope_id = local_58._4_4_;
  pmVar5->fInTried = (bool)(undefined1)local_40;
  *(undefined3 *)&pmVar5->field_0x79 = local_40._1_3_;
  pmVar5->nRandomPos = local_40._4_4_;
  (pmVar5->m_last_success).__d.__r = local_50;
  pmVar5->nAttempts = (undefined4)uStack_48;
  pmVar5->nRefCount = uStack_48._4_4_;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  lVar3 = local_c0;
  pmVar6 = std::__detail::
           _Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->mapAddr,&addr->super_CService);
  *pmVar6 = lVar3;
  plVar1 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar2 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar5 = std::__detail::
           _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_c0);
  pmVar5->nRandomPos = (int)((ulong)((long)plVar1 - (long)plVar2) >> 3);
  __position._M_current =
       (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&this->vRandom,__position,&local_c0);
  }
  else {
    *__position._M_current = local_c0;
    (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this->nNew = this->nNew + 1;
  NVar4 = CNetAddr::GetNetwork((CNetAddr *)addr);
  local_b8._0_4_ = NVar4;
  pmVar7 = std::__detail::
           _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_network_counts,(key_type *)local_b8.direct);
  pmVar7->n_new = pmVar7->n_new + 1;
  if (pnId != (nid_type *)0x0) {
    *pnId = local_c0;
  }
  pmVar5 = std::__detail::
           _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pmVar5;
  }
  __stack_chk_fail();
}

Assistant:

AddrInfo* AddrManImpl::Create(const CAddress& addr, const CNetAddr& addrSource, nid_type* pnId)
{
    AssertLockHeld(cs);

    nid_type nId = nIdCount++;
    mapInfo[nId] = AddrInfo(addr, addrSource);
    mapAddr[addr] = nId;
    mapInfo[nId].nRandomPos = vRandom.size();
    vRandom.push_back(nId);
    nNew++;
    m_network_counts[addr.GetNetwork()].n_new++;
    if (pnId)
        *pnId = nId;
    return &mapInfo[nId];
}